

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O3

void __thiscall
presolve::HighsPostsolveStack::forcingRow<HighsTripletPositionSlice>
          (HighsPostsolveStack *this,HighsInt row,
          HighsMatrixSlice<HighsTripletPositionSlice> *rowVec,double side,RowType rowType)

{
  int iVar1;
  int iVar2;
  pointer pNVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  int *piVar10;
  size_t position;
  ReductionType local_59;
  HighsInt local_58;
  RowType local_54;
  vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
  *local_50;
  double local_48;
  double local_40;
  HighsInt *local_38;
  
  pNVar3 = (this->rowValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rowValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->rowValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  local_50 = (vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
              *)&this->rowValues;
  iVar1 = rowVec->len;
  local_58 = row;
  local_54 = rowType;
  local_40 = side;
  if ((long)iVar1 != 0) {
    local_38 = rowVec->nodePositions;
    piVar10 = rowVec->nodeIndex;
    pdVar8 = rowVec->nodeValue;
    lVar9 = 0;
    iVar7 = 0;
    do {
      iVar2 = *(int *)((long)local_38 + lVar9);
      iVar7 = iVar2 - iVar7;
      piVar10 = piVar10 + iVar7;
      pdVar8 = pdVar8 + iVar7;
      local_48 = *pdVar8;
      std::
      vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
      ::emplace_back<int&,double>
                (local_50,(this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start + *piVar10,&local_48);
      lVar9 = lVar9 + 4;
      iVar7 = iVar2;
    } while ((long)iVar1 * 4 != lVar9);
  }
  pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_58];
  pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize
            (&(this->reductionValues).data,(size_type)(pcVar4 + (0x10 - (long)pcVar5)));
  pcVar6 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(double *)(pcVar4 + ((long)pcVar6 - (long)pcVar5)) = local_40;
  *(int *)(pcVar4 + (long)(pcVar6 + (8 - (long)pcVar5))) = iVar1;
  *(RowType *)(pcVar4 + (long)(pcVar6 + (0xc - (long)pcVar5))) = local_54;
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,
             (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
              *)local_50);
  local_59 = kForcingRow;
  local_48 = (double)((long)(this->reductionValues).data.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->reductionValues).data.
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_59,(unsigned_long *)&local_48);
  return;
}

Assistant:

void forcingRow(HighsInt row,
                  const HighsMatrixSlice<RowStorageFormat>& rowVec, double side,
                  RowType rowType) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : rowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(ForcingRow{side, origRowIndex[row], rowType});
    reductionValues.push(rowValues);
    reductionAdded(ReductionType::kForcingRow);
  }